

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O2

int32_t ustrcase_internalFold_63
                  (int32_t param_1,uint32_t options,BreakIterator *param_3,UChar *dest,
                  int32_t destCapacity,UChar *src,int32_t srcLength,Edits *edits,
                  UErrorCode *errorCode)

{
  int32_t iVar1;
  
  iVar1 = icu_63::anon_unknown_9::toLower
                    (-1,options,dest,destCapacity,src,(UCaseContext *)0x0,0,srcLength,edits,
                     errorCode);
  iVar1 = icu_63::anon_unknown_9::checkOverflowAndEditsError(iVar1,destCapacity,edits,errorCode);
  return iVar1;
}

Assistant:

U_CFUNC int32_t U_CALLCONV
ustrcase_internalFold(int32_t /* caseLocale */, uint32_t options, UCASEMAP_BREAK_ITERATOR_UNUSED
                      UChar *dest, int32_t destCapacity,
                      const UChar *src, int32_t srcLength,
                      icu::Edits *edits,
                      UErrorCode &errorCode) {
    int32_t destIndex = toLower(
        -1, options,
        dest, destCapacity,
        src, nullptr, 0, srcLength,
        edits, errorCode);
    return checkOverflowAndEditsError(destIndex, destCapacity, edits, errorCode);
}